

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_Drawer(void)

{
  double byoffset;
  DWORD DVar1;
  int iVar2;
  AInventory *pAVar3;
  AActor *this;
  bool showlocks;
  AMColorset *__src;
  FColorCVar **values;
  uchar *colors;
  bool bVar4;
  sector_t_conflict *sec;
  DVector3 local_30;
  
  DVar1 = level.flags2;
  if (!automapactive) {
    return;
  }
  iVar2 = 0;
  bVar4 = false;
  if ((level.flags2 & 2) != 0) {
    pAVar3 = AActor::FindInventory
                       ((AActor *)(&players)[(long)consoleplayer * 0x54],
                        (PClassActor *)APowerScanner::RegistrationInfo.MyClass,true);
    bVar4 = pAVar3 != (AInventory *)0x0;
  }
  if (am_portaloverlay.Value == true) {
    byoffset = (double)(&DAT_017dbfe8)[(long)consoleplayer * 0x54];
    this = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    AActor::GetPortalTransition(&local_30,this,byoffset,(sector_t **)&sec);
    iVar2 = sec->PortalGroup;
  }
  MapPortalGroup = iVar2;
  if (viewactive == true) {
    if ((am_customcolors.Value == false) || (AMModOverlay.defined != true)) {
      values = cv_overlay;
LAB_0036736e:
      AMColorset::initFromCVars(&AMColors,values);
      goto LAB_003673b8;
    }
    __src = &AMModOverlay;
  }
  else {
    if ((am_customcolors.Value == false) || (AMMod.defined != true)) {
      if (am_colorset.Value == 1) {
        colors = DoomColors;
LAB_003673b1:
        showlocks = false;
      }
      else {
        if (am_colorset.Value == 2) {
          colors = StrifeColors;
          goto LAB_003673b1;
        }
        if (am_colorset.Value != 3) {
          values = cv_standard;
          goto LAB_0036736e;
        }
        colors = RavenColors;
        showlocks = true;
      }
      AMColorset::initFromColors(&AMColors,colors,showlocks);
      goto LAB_003673b8;
    }
    __src = &AMMod;
  }
  memcpy(&AMColors,__src,0xc4);
LAB_003673b8:
  if (viewactive == false) {
    f_y = 0;
    f_x = 0;
    f_w = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    f_h = ST_Y;
    AM_clearFB(AMColors.c);
  }
  else {
    f_x = viewwindowx;
    f_y = viewwindowy;
    f_w = viewwidth;
    f_h = viewheight;
  }
  AM_activateNewScale();
  if ((((am_textured.Value == true) && (hasglnodes == true)) && (textured == true)) &&
     (viewactive == false)) {
    AM_drawSubsectors();
  }
  if (grid != 0) {
    AM_drawGrid(0xf);
  }
  AM_drawWalls(SUB41((DVar1 & 2) >> 1,0));
  AM_drawPlayers();
  iVar2 = G_SkillProperty(SKILLP_EasyKey);
  if (iVar2 != 0) {
    AM_drawKeys();
  }
  if (1 < am_cheat.Value) {
    bVar4 = (bool)(bVar4 | am_cheat.Value != 4);
  }
  if (bVar4) {
    AM_drawThings();
  }
  AM_drawAuthorMarkers();
  if (viewactive == false) {
    AM_drawCrosshair(AMColors.c + 0x10);
  }
  AM_drawMarks();
  AM_showSS();
  return;
}

Assistant:

void AM_Drawer ()
{
	if (!automapactive)
		return;

	bool allmap = (level.flags2 & LEVEL2_ALLMAP) != 0;
	bool allthings = allmap && players[consoleplayer].mo->FindInventory(RUNTIME_CLASS(APowerScanner), true) != NULL;

	if (am_portaloverlay)
	{
		sector_t *sec;
		double vh = players[consoleplayer].viewheight;
		players[consoleplayer].camera->GetPortalTransition(vh, &sec);
		MapPortalGroup = sec->PortalGroup;
	}
	else MapPortalGroup = 0;
	AM_initColors (viewactive);

	if (!viewactive)
	{
		// [RH] Set f_? here now to handle automap overlaying
		// and view size adjustments.
		f_x = f_y = 0;
		f_w = screen->GetWidth ();
		f_h = ST_Y;
		f_p = screen->GetPitch ();

		AM_clearFB(AMColors[AMColors.Background]);
	}
	else 
	{
		f_x = viewwindowx;
		f_y = viewwindowy;
		f_w = viewwidth;
		f_h = viewheight;
		f_p = screen->GetPitch ();
	}
	AM_activateNewScale();

	if (am_textured && hasglnodes && textured && !viewactive)
		AM_drawSubsectors();

	if (grid)	
		AM_drawGrid(AMColors.GridColor);

	AM_drawWalls(allmap);
	AM_drawPlayers();
	if (G_SkillProperty(SKILLP_EasyKey))
		AM_drawKeys();
	if ((am_cheat >= 2 && am_cheat != 4) || allthings)
		AM_drawThings();

	AM_drawAuthorMarkers();

	if (!viewactive)
		AM_drawCrosshair(AMColors[AMColors.XHairColor]);

	AM_drawMarks();

	AM_showSS();
}